

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_HTMLparser(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  uint uVar39;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing HTMLparser : 37 of 43 functions ...\n");
  }
  iVar1 = test_htmlAttrAllowed();
  iVar2 = test_htmlAutoCloseTag();
  iVar3 = test_htmlCreateFileParserCtxt();
  iVar4 = test_htmlCreateMemoryParserCtxt();
  iVar5 = test_htmlCreatePushParserCtxt();
  iVar6 = test_htmlCtxtParseDocument();
  iVar7 = test_htmlCtxtReadDoc();
  iVar8 = test_htmlCtxtReadFile();
  iVar9 = test_htmlCtxtReadMemory();
  iVar10 = test_htmlCtxtReset();
  iVar11 = test_htmlCtxtSetOptions();
  iVar12 = test_htmlCtxtUseOptions();
  iVar13 = test_htmlElementAllowedHere();
  iVar14 = test_htmlElementStatusHere();
  iVar15 = test_htmlEncodeEntities();
  iVar16 = test_htmlEntityLookup();
  iVar17 = test_htmlEntityValueLookup();
  iVar18 = test_htmlHandleOmittedElem();
  iVar19 = test_htmlInitAutoClose();
  iVar20 = test_htmlIsAutoClosed();
  iVar21 = test_htmlIsScriptAttribute();
  iVar22 = test_htmlNewParserCtxt();
  iVar23 = test_htmlNewSAXParserCtxt();
  iVar24 = test_htmlNodeStatus();
  iVar25 = test_htmlParseCharRef();
  iVar26 = test_htmlParseChunk();
  iVar27 = test_htmlParseDoc();
  iVar28 = test_htmlParseDocument();
  iVar29 = test_htmlParseElement();
  iVar30 = test_htmlParseEntityRef();
  iVar31 = test_htmlParseFile();
  iVar32 = test_htmlReadDoc();
  iVar33 = test_htmlReadFile();
  iVar34 = test_htmlReadMemory();
  iVar35 = test_htmlSAXParseDoc();
  iVar36 = test_htmlSAXParseFile();
  iVar37 = test_htmlTagLookup();
  iVar38 = test_htmlUTF8ToHtml();
  uVar39 = iVar38 + iVar37 + iVar36 + iVar35 + iVar34 + iVar33 + iVar32 + iVar31 + iVar30 + iVar29 +
                                                                                            iVar28 +
                                                                                            iVar27 +
                                                                                            iVar26 +
                                                                                            iVar25 +
                                                                                            iVar24 +
                                                                                            iVar23 +
                                                                                            iVar22 +
                                                                                            iVar21 +
                                                                                            iVar20 +
                                                                                            iVar19 +
                                                                                            iVar18 +
                                                                                            iVar17 +
                                                                                            iVar16 +
                                                                                            iVar15 +
                                                                                            iVar14 +
                                                                                            iVar13 +
                                                                                            iVar12 +
                                                                                            iVar11 +
                                                                                            iVar10 +
                                                                                            iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar39 != 0) {
    printf("Module HTMLparser: %d errors\n",(ulong)uVar39);
  }
  return uVar39;
}

Assistant:

static int
test_HTMLparser(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing HTMLparser : 37 of 43 functions ...\n");
    test_ret += test_htmlAttrAllowed();
    test_ret += test_htmlAutoCloseTag();
    test_ret += test_htmlCreateFileParserCtxt();
    test_ret += test_htmlCreateMemoryParserCtxt();
    test_ret += test_htmlCreatePushParserCtxt();
    test_ret += test_htmlCtxtParseDocument();
    test_ret += test_htmlCtxtReadDoc();
    test_ret += test_htmlCtxtReadFile();
    test_ret += test_htmlCtxtReadMemory();
    test_ret += test_htmlCtxtReset();
    test_ret += test_htmlCtxtSetOptions();
    test_ret += test_htmlCtxtUseOptions();
    test_ret += test_htmlElementAllowedHere();
    test_ret += test_htmlElementStatusHere();
    test_ret += test_htmlEncodeEntities();
    test_ret += test_htmlEntityLookup();
    test_ret += test_htmlEntityValueLookup();
    test_ret += test_htmlHandleOmittedElem();
    test_ret += test_htmlInitAutoClose();
    test_ret += test_htmlIsAutoClosed();
    test_ret += test_htmlIsScriptAttribute();
    test_ret += test_htmlNewParserCtxt();
    test_ret += test_htmlNewSAXParserCtxt();
    test_ret += test_htmlNodeStatus();
    test_ret += test_htmlParseCharRef();
    test_ret += test_htmlParseChunk();
    test_ret += test_htmlParseDoc();
    test_ret += test_htmlParseDocument();
    test_ret += test_htmlParseElement();
    test_ret += test_htmlParseEntityRef();
    test_ret += test_htmlParseFile();
    test_ret += test_htmlReadDoc();
    test_ret += test_htmlReadFile();
    test_ret += test_htmlReadMemory();
    test_ret += test_htmlSAXParseDoc();
    test_ret += test_htmlSAXParseFile();
    test_ret += test_htmlTagLookup();
    test_ret += test_htmlUTF8ToHtml();

    if (test_ret != 0)
	printf("Module HTMLparser: %d errors\n", test_ret);
    return(test_ret);
}